

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daxpy.c
# Opt level: O1

void daxpy_(integer *n,doublereal *da,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar1 = *n;
  if ((0 < (int)uVar1) && ((*da != 0.0 || (NAN(*da))))) {
    iVar2 = *incx;
    if (((long)iVar2 == 1) && (*incy == 1)) {
      if ((uVar1 & 3) != 0) {
        uVar8 = 0;
        do {
          dy[uVar8] = *da * dx[uVar8] + dy[uVar8];
          uVar8 = uVar8 + 1;
        } while ((uVar1 & 3) != uVar8);
        if ((int)uVar1 < 4) {
          return;
        }
      }
      uVar8 = (ulong)(uVar1 & 3) + 1;
      do {
        dy[uVar8 - 1] = *da * dx[uVar8 - 1] + dy[uVar8 - 1];
        dy[uVar8] = *da * dx[uVar8] + dy[uVar8];
        dy[uVar8 + 1] = *da * dx[uVar8 + 1] + dy[uVar8 + 1];
        dy[uVar8 + 2] = *da * dx[uVar8 + 2] + dy[uVar8 + 2];
        uVar8 = uVar8 + 4;
      } while (uVar8 <= uVar1);
    }
    else {
      iVar3 = *incy;
      iVar4 = (1 - uVar1) * iVar3 + 1;
      if (-1 < (long)iVar3) {
        iVar4 = 1;
      }
      iVar5 = (1 - uVar1) * iVar2 + 1;
      if (-1 < iVar2) {
        iVar5 = 1;
      }
      uVar9 = 1;
      if (1 < (int)uVar1) {
        uVar9 = uVar1;
      }
      pdVar6 = dx + (long)iVar5 + -1;
      pdVar7 = dy + (long)iVar4 + -1;
      do {
        *pdVar7 = *da * *pdVar6 + *pdVar7;
        pdVar6 = pdVar6 + iVar2;
        pdVar7 = pdVar7 + iVar3;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

void daxpy_(integer *n, doublereal *da, doublereal *dx, 
	integer *incx, doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     constant times a vector plus a vector.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*da == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) += *da * DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 4;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) += *da * DX(i);
/* L30: */
    }
    if (*n < 4) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 4) {
	DY(i) += *da * DX(i);
	DY(i + 1) += *da * DX(i + 1);
	DY(i + 2) += *da * DX(i + 2);
	DY(i + 3) += *da * DX(i + 3);
/* L50: */
    }
    return;
}